

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_110;
  cmAlphaNum local_d8;
  cmAlphaNum local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  string_view local_50;
  string *local_40;
  string_view local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  local_a0.RValueString_ = (string *)0x0;
  local_a0.View_._M_str = (a->_M_dataplus)._M_p;
  local_a0.View_._M_len = a->_M_string_length;
  local_68.first = cmAlphaNum::View(&local_a0);
  local_68.second = local_a0.RValueString_;
  local_110.Digits_[0] = *b;
  local_110.View_._M_str = local_110.Digits_;
  local_110.RValueString_ = (string *)0x0;
  local_110.View_._M_len = 1;
  local_50 = cmAlphaNum::View(&local_110);
  local_40 = local_110.RValueString_;
  local_d8.View_._M_len = 0;
  local_d8.View_._M_str = (char *)0x0;
  local_d8.RValueString_ = args;
  local_38 = cmAlphaNum::View(&local_d8);
  local_28 = local_d8.RValueString_;
  views._M_len = 3;
  views._M_array = &local_68;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}